

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

bool duckdb::ParquetMultiFileInfo::TryInitializeScan
               (ClientContext *context,shared_ptr<duckdb::BaseFileReader,_true> *reader_p,
               GlobalTableFunctionState *gstate_p,LocalTableFunctionState *lstate_p)

{
  ulong uVar1;
  ParquetReader *this;
  idx_t iVar2;
  initializer_list<unsigned_long> __l;
  vector<unsigned_long,_true> group_indexes;
  allocator_type local_69;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  unsigned_long local_38;
  
  this = (ParquetReader *)shared_ptr<duckdb::BaseFileReader,_true>::operator->(reader_p);
  uVar1 = *(ulong *)(gstate_p + 8);
  iVar2 = ParquetReader::NumRowGroups(this);
  if (uVar1 < iVar2) {
    local_38 = *(unsigned_long *)(gstate_p + 8);
    __l._M_len = 1;
    __l._M_array = &local_38;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_50,__l,&local_69);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_68,&local_50);
    ParquetReader::InitializeScan
              (this,context,(ParquetReaderScanState *)(lstate_p + 8),
               (vector<unsigned_long,_true> *)&local_68);
    if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    *(long *)(gstate_p + 8) = *(long *)(gstate_p + 8) + 1;
    if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return uVar1 < iVar2;
}

Assistant:

bool ParquetMultiFileInfo::TryInitializeScan(ClientContext &context, shared_ptr<BaseFileReader> &reader_p,
                                             GlobalTableFunctionState &gstate_p, LocalTableFunctionState &lstate_p) {
	auto &gstate = gstate_p.Cast<ParquetReadGlobalState>();
	auto &lstate = lstate_p.Cast<ParquetReadLocalState>();
	auto &reader = reader_p->Cast<ParquetReader>();
	if (gstate.row_group_index >= reader.NumRowGroups()) {
		// scanned all row groups in this file
		return false;
	}
	// The current reader has rowgroups left to be scanned
	vector<idx_t> group_indexes {gstate.row_group_index};
	reader.InitializeScan(context, lstate.scan_state, group_indexes);
	gstate.row_group_index++;
	return true;
}